

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

bool jsonip::parse<jsonip::value>(value *t,istream *is)

{
  undefined1 auVar1 [16];
  IStreamReader local_90;
  IStreamReader reader;
  semantic_state ss;
  undefined1 local_58 [8];
  state st;
  
  st.ss_ = (semantic_state *)detail::calculate_helper<jsonip::value>::instance();
  local_58 = (undefined1  [8])t;
  semantic_state::semantic_state((semantic_state *)&reader,(state_t *)local_58);
  local_90.in_ = is;
  parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::ReaderState
            ((ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *)local_58,
             (semantic_state *)&reader,&local_90);
  auVar1 = std::istream::tellg();
  ss.state.
  super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar1._0_8_;
  if (st.stack_.
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      st.stack_.
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>::State>>
                *)&st.reader_,
               (iterator)
               st.stack_.
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (State *)&ss.state.
                         super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    (st.stack_.
     super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
     ._M_impl.super__Vector_impl_data._M_start)->line_ = st._48_8_;
    (st.stack_.
     super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos_ = (PositionType)auVar1[0];
    *(long *)&(st.stack_.
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x1 = auVar1._1_8_;
    *(int7 *)&(st.stack_.
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x9 = auVar1._9_7_;
    st.stack_.
    super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
    ._M_impl.super__Vector_impl_data._M_start =
         st.stack_.
         super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  parser::
  seq_<jsonip::grammar::spaces_,jsonip::grammar::atom,jsonip::grammar::spaces_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
  ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
            ((ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *)local_58);
  auVar1 = std::istream::tellg();
  if ((long)st.stack_.
            super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage < auVar1._0_8_) {
    st._32_16_ = auVar1;
  }
  st.stack_.
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
  ._M_impl.super__Vector_impl_data._M_start =
       st.stack_.
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
       ._M_impl.super__Vector_impl_data._M_start + -1;
  if (st.reader_ != (IStreamReader *)0x0) {
    operator_delete(st.reader_,
                    (long)st.stack_.
                          super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)st.reader_);
  }
  if (reader.in_ != (istream *)0x0) {
    operator_delete(reader.in_,
                    (long)ss.state.
                          super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)reader.in_);
  }
  return true;
}

Assistant:

bool parse(T& t, std::istream& is)
    {
        typedef parser::ReaderState<semantic_state, parser::IStreamReader> state;
        semantic_state ss(std::make_pair(holder(&t), detail::get_helper(t)));
        parser::IStreamReader reader(is);
        state st(ss, reader);

        return jsonip::grammar::gram::match(st);
    }